

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mbedtls_mpi_div_mpi(mbedtls_mpi *Q,mbedtls_mpi *R,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int iVar1;
  size_t sVar2;
  mbedtls_mpi_uint mVar3;
  mbedtls_mpi *in_RCX;
  long lVar4;
  mbedtls_mpi *in_RDX;
  long in_RSI;
  long in_RDI;
  mbedtls_mpi_uint TP2 [3];
  mbedtls_mpi T2;
  mbedtls_mpi T1;
  mbedtls_mpi Z;
  mbedtls_mpi Y;
  mbedtls_mpi X;
  size_t k;
  size_t t;
  size_t n;
  size_t i;
  int ret;
  mbedtls_mpi *in_stack_ffffffffffffff28;
  mbedtls_mpi *in_stack_ffffffffffffff30;
  mbedtls_mpi *in_stack_ffffffffffffff38;
  mbedtls_mpi *in_stack_ffffffffffffff40;
  mbedtls_mpi *in_stack_ffffffffffffff48;
  mbedtls_mpi_uint in_stack_ffffffffffffff50;
  mbedtls_mpi_uint in_stack_ffffffffffffff58;
  mbedtls_mpi local_a0;
  mbedtls_mpi local_90;
  mbedtls_mpi local_80;
  mbedtls_mpi local_70;
  mbedtls_mpi local_60;
  long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  int local_2c;
  mbedtls_mpi *local_28;
  mbedtls_mpi *local_20;
  long local_18;
  long local_10;
  
  local_2c = 0xffffff92;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffff40,(mbedtls_mpi_sint)in_stack_ffffffffffffff38)
  ;
  if (iVar1 == 0) {
    return -0xc;
  }
  mbedtls_mpi_init(&local_60);
  mbedtls_mpi_init(&local_70);
  mbedtls_mpi_init(&local_80);
  mbedtls_mpi_init(&local_90);
  local_a0.s = 1;
  local_a0.n = 3;
  local_a0.p = (mbedtls_mpi_uint *)&stack0xffffffffffffff48;
  iVar1 = mbedtls_mpi_cmp_abs(local_20,local_28);
  if (iVar1 < 0) {
    if (local_10 != 0) {
      local_2c = mbedtls_mpi_lset(in_stack_ffffffffffffff30,
                                  (mbedtls_mpi_sint)in_stack_ffffffffffffff28);
      if (local_2c != 0) goto LAB_0273dc71;
      local_2c = 0;
    }
    if ((local_18 == 0) ||
       (local_2c = mbedtls_mpi_copy(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30),
       local_2c == 0)) {
      return 0;
    }
  }
  else {
    local_2c = mbedtls_mpi_copy(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    if ((local_2c == 0) &&
       (local_2c = mbedtls_mpi_copy(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30),
       local_2c == 0)) {
      local_70.s = 1;
      local_60.s = 1;
      local_2c = mbedtls_mpi_grow(in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30);
      if ((local_2c == 0) &&
         ((local_2c = mbedtls_mpi_lset(in_stack_ffffffffffffff30,
                                       (mbedtls_mpi_sint)in_stack_ffffffffffffff28), local_2c == 0
          && (local_2c = mbedtls_mpi_grow(in_stack_ffffffffffffff38,
                                          (size_t)in_stack_ffffffffffffff30), local_2c == 0)))) {
        sVar2 = mbedtls_mpi_bitlen((mbedtls_mpi *)0x273d628);
        if ((sVar2 & 0x3f) < 0x3f) {
          local_50 = 0x3f - (sVar2 & 0x3f);
          local_2c = mbedtls_mpi_shift_l(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38
                                        );
          if ((local_2c != 0) ||
             (local_2c = mbedtls_mpi_shift_l(in_stack_ffffffffffffff40,
                                             (size_t)in_stack_ffffffffffffff38), local_2c != 0))
          goto LAB_0273dc71;
          local_2c = 0;
        }
        else {
          local_50 = 0;
        }
        local_40 = (ulong)(int)(local_60.n - 1);
        local_48 = (ulong)(int)(local_70.n - 1);
        local_2c = mbedtls_mpi_shift_l(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
        while (local_2c == 0) {
          local_2c = 0;
          iVar1 = mbedtls_mpi_cmp_mpi(&local_60,&local_70);
          if (iVar1 < 0) {
            local_2c = mbedtls_mpi_shift_r(in_stack_ffffffffffffff30,
                                           (size_t)in_stack_ffffffffffffff28);
            if (local_2c == 0) {
              local_38 = local_40;
              goto LAB_0273d7a7;
            }
            break;
          }
          local_80.p[local_40 - local_48] = local_80.p[local_40 - local_48] + 1;
          local_2c = mbedtls_mpi_sub_mpi(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                                         (mbedtls_mpi *)0x273d74f);
        }
      }
    }
  }
LAB_0273dc71:
  mbedtls_mpi_free((mbedtls_mpi *)0x273dc7b);
  mbedtls_mpi_free((mbedtls_mpi *)0x273dc85);
  mbedtls_mpi_free((mbedtls_mpi *)0x273dc8f);
  mbedtls_mpi_free((mbedtls_mpi *)0x273dc99);
  mbedtls_platform_zeroize(in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
  return local_2c;
LAB_0273d7a7:
  if (local_38 <= local_48) goto LAB_0273db84;
  if (local_60.p[local_38] < local_70.p[local_48]) {
    mVar3 = mbedtls_int_div_int(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                (mbedtls_mpi_uint)in_stack_ffffffffffffff48,
                                (mbedtls_mpi_uint *)in_stack_ffffffffffffff40);
    local_80.p[(local_38 - local_48) + -1] = mVar3;
  }
  else {
    local_80.p[(local_38 - local_48) + -1] = 0xffffffffffffffff;
  }
  if (local_38 < 2) {
    in_stack_ffffffffffffff40 = (mbedtls_mpi *)0x0;
  }
  else {
    in_stack_ffffffffffffff40 = (mbedtls_mpi *)local_60.p[local_38 - 2];
  }
  *local_a0.p = (mbedtls_mpi_uint)in_stack_ffffffffffffff40;
  if (local_38 == 0) {
    in_stack_ffffffffffffff38 = (mbedtls_mpi *)0x0;
  }
  else {
    in_stack_ffffffffffffff38 = (mbedtls_mpi *)local_60.p[local_38 - 1];
  }
  local_a0.p[1] = (mbedtls_mpi_uint)in_stack_ffffffffffffff38;
  local_a0.p[2] = local_60.p[local_38];
  lVar4 = (local_38 - local_48) + -1;
  local_80.p[lVar4] = local_80.p[lVar4] + 1;
  do {
    lVar4 = (local_38 - local_48) + -1;
    local_80.p[lVar4] = local_80.p[lVar4] - 1;
    local_2c = mbedtls_mpi_lset(in_stack_ffffffffffffff30,
                                (mbedtls_mpi_sint)in_stack_ffffffffffffff28);
    if (local_2c != 0) goto LAB_0273dc71;
    if (local_48 == 0) {
      in_stack_ffffffffffffff30 = (mbedtls_mpi *)0x0;
    }
    else {
      in_stack_ffffffffffffff30 = (mbedtls_mpi *)local_70.p[local_48 - 1];
    }
    *local_90.p = (mbedtls_mpi_uint)in_stack_ffffffffffffff30;
    local_90.p[1] = local_70.p[local_48];
    local_2c = mbedtls_mpi_mul_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                   (mbedtls_mpi_uint)in_stack_ffffffffffffff38);
    if (local_2c != 0) goto LAB_0273dc71;
    iVar1 = mbedtls_mpi_cmp_mpi(&local_90,&local_a0);
  } while (0 < iVar1);
  local_2c = mbedtls_mpi_mul_int(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                 (mbedtls_mpi_uint)in_stack_ffffffffffffff38);
  if (((local_2c != 0) ||
      (local_2c = mbedtls_mpi_shift_l(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38),
      local_2c != 0)) ||
     (local_2c = mbedtls_mpi_sub_mpi(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                                     (mbedtls_mpi *)0x273da98), local_2c != 0)) goto LAB_0273dc71;
  iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffff40,(mbedtls_mpi_sint)in_stack_ffffffffffffff38)
  ;
  if (iVar1 < 0) {
    local_2c = mbedtls_mpi_copy(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    if (((local_2c != 0) ||
        (local_2c = mbedtls_mpi_shift_l(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38)
        , local_2c != 0)) ||
       (local_2c = mbedtls_mpi_add_mpi(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                                       (mbedtls_mpi *)0x273db31), local_2c != 0)) goto LAB_0273dc71;
    lVar4 = (local_38 - local_48) + -1;
    local_80.p[lVar4] = local_80.p[lVar4] - 1;
  }
  local_38 = local_38 - 1;
  goto LAB_0273d7a7;
LAB_0273db84:
  if (local_10 != 0) {
    local_2c = mbedtls_mpi_copy(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    if (local_2c != 0) goto LAB_0273dc71;
    *(short *)(local_10 + 8) = local_20->s * local_28->s;
  }
  if ((local_18 != 0) &&
     (local_2c = mbedtls_mpi_shift_r(in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28),
     local_2c == 0)) {
    local_60.s = local_20->s;
    local_2c = mbedtls_mpi_copy(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    if ((local_2c == 0) &&
       (iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffff40,
                                    (mbedtls_mpi_sint)in_stack_ffffffffffffff38), iVar1 == 0)) {
      *(undefined2 *)(local_18 + 8) = 1;
    }
  }
  goto LAB_0273dc71;
}

Assistant:

int mbedtls_mpi_div_mpi(mbedtls_mpi *Q, mbedtls_mpi *R, const mbedtls_mpi *A,
                        const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, n, t, k;
    mbedtls_mpi X, Y, Z, T1, T2;
    mbedtls_mpi_uint TP2[3];

    if (mbedtls_mpi_cmp_int(B, 0) == 0) {
        return MBEDTLS_ERR_MPI_DIVISION_BY_ZERO;
    }

    mbedtls_mpi_init(&X); mbedtls_mpi_init(&Y); mbedtls_mpi_init(&Z);
    mbedtls_mpi_init(&T1);
    /*
     * Avoid dynamic memory allocations for constant-size T2.
     *
     * T2 is used for comparison only and the 3 limbs are assigned explicitly,
     * so nobody increase the size of the MPI and we're safe to use an on-stack
     * buffer.
     */
    T2.s = 1;
    T2.n = sizeof(TP2) / sizeof(*TP2);
    T2.p = TP2;

    if (mbedtls_mpi_cmp_abs(A, B) < 0) {
        if (Q != NULL) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_lset(Q, 0));
        }
        if (R != NULL) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_copy(R, A));
        }
        return 0;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&X, A));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&Y, B));
    X.s = Y.s = 1;

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&Z, A->n + 2));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&Z,  0));
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(&T1, A->n + 2));

    k = mbedtls_mpi_bitlen(&Y) % biL;
    if (k < biL - 1) {
        k = biL - 1 - k;
        MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(&X, k));
        MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(&Y, k));
    } else {
        k = 0;
    }

    n = X.n - 1;
    t = Y.n - 1;
    MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(&Y, biL * (n - t)));

    while (mbedtls_mpi_cmp_mpi(&X, &Y) >= 0) {
        Z.p[n - t]++;
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&X, &X, &Y));
    }
    MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&Y, biL * (n - t)));

    for (i = n; i > t; i--) {
        if (X.p[i] >= Y.p[t]) {
            Z.p[i - t - 1] = ~(mbedtls_mpi_uint) 0u;
        } else {
            Z.p[i - t - 1] = mbedtls_int_div_int(X.p[i], X.p[i - 1],
                                                 Y.p[t], NULL);
        }

        T2.p[0] = (i < 2) ? 0 : X.p[i - 2];
        T2.p[1] = (i < 1) ? 0 : X.p[i - 1];
        T2.p[2] = X.p[i];

        Z.p[i - t - 1]++;
        do {
            Z.p[i - t - 1]--;

            MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&T1, 0));
            T1.p[0] = (t < 1) ? 0 : Y.p[t - 1];
            T1.p[1] = Y.p[t];
            MBEDTLS_MPI_CHK(mbedtls_mpi_mul_int(&T1, &T1, Z.p[i - t - 1]));
        } while (mbedtls_mpi_cmp_mpi(&T1, &T2) > 0);

        MBEDTLS_MPI_CHK(mbedtls_mpi_mul_int(&T1, &Y, Z.p[i - t - 1]));
        MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(&T1,  biL * (i - t - 1)));
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&X, &X, &T1));

        if (mbedtls_mpi_cmp_int(&X, 0) < 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&T1, &Y));
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_l(&T1, biL * (i - t - 1)));
            MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&X, &X, &T1));
            Z.p[i - t - 1]--;
        }
    }

    if (Q != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(Q, &Z));
        Q->s = A->s * B->s;
    }

    if (R != NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&X, k));
        X.s = A->s;
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(R, &X));

        if (mbedtls_mpi_cmp_int(R, 0) == 0) {
            R->s = 1;
        }
    }

cleanup:

    mbedtls_mpi_free(&X); mbedtls_mpi_free(&Y); mbedtls_mpi_free(&Z);
    mbedtls_mpi_free(&T1);
    mbedtls_platform_zeroize(TP2, sizeof(TP2));

    return ret;
}